

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::UntypedPerformAction
          (FunctionMocker<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  Action<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  action;
  function<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_30;
  
  std::
  function<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  function(&local_30,
           (function<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            *)untyped_action);
  pAVar1 = ActionResultHolder<ot::commissioner::Error>::
           PerformAction<ot::commissioner::Error(std::vector<unsigned_char,std::allocator<unsigned_char>>&)>
                     ((Action<ot::commissioner::Error_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                       *)&local_30,(ArgumentTuple *)untyped_args);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }